

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O2

void __thiscall ot::commissioner::DtlsSession::Disconnect(DtlsSession *this,Error *aError)

{
  char *begin;
  char *pcVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  allocator local_c1;
  string local_c0;
  string local_a0;
  undefined1 local_80 [40];
  DtlsSession *local_58;
  char *local_50;
  size_t local_48;
  undefined8 local_40;
  format_string_checker<char> *local_38;
  code *local_30;
  
  if (this->mState - kConnecting < 2) {
    if ((this->mState == kConnected) && (aError->mCode == kCancelled)) {
      mbedtls_ssl_close_notify(&this->mSsl);
    }
    this->mState = kDisconnected;
    if ((this->mOnConnected).super__Function_base._M_manager != (_Manager_type)0x0) {
      Error::Error((Error *)local_80,aError);
      std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::operator()
                (&this->mOnConnected,this,(Error *)local_80);
      std::__cxx11::string::~string((string *)(local_80 + 8));
      std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::operator=
                (&this->mOnConnected,(nullptr_t)0x0);
    }
    Reset(this);
    std::__cxx11::string::string((string *)&local_a0,"dtls",&local_c1);
    local_58 = (DtlsSession *)CONCAT44(local_58._4_4_,pointer_type);
    local_50 = "session(={}) disconnected";
    local_48 = 0x19;
    local_40._0_4_ = 0;
    local_40._4_4_ = 1;
    local_30 = ::fmt::v10::detail::
               parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
    pcVar1 = "session(={}) disconnected";
    local_38 = (format_string_checker<char> *)&local_58;
    while (begin = pcVar1, begin != "") {
      pcVar1 = begin + 1;
      if (*begin == '}') {
        if ((pcVar1 == "") || (*pcVar1 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar1 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar1 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*>&>
                           (begin,"",(format_string_checker<char> *)&local_58);
      }
    }
    fmt.size_ = 0xe;
    fmt.data_ = (char *)0x19;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_58;
    local_58 = this;
    ::fmt::v10::vformat_abi_cxx11_(&local_c0,(v10 *)"session(={}) disconnected",fmt,args);
    Log(kDebug,&local_a0,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  return;
}

Assistant:

void DtlsSession::Disconnect(Error aError)
{
    VerifyOrExit(mState == State::kConnecting || mState == State::kConnected);

    // Send close notify if the connected session is cancelled by user.
    if (mState == State::kConnected && aError == ErrorCode::kCancelled)
    {
        // We don't care if the notify has been successfully delivered.
        mbedtls_ssl_close_notify(&mSsl);
    }

    mState = State::kDisconnected;
    if (mOnConnected != nullptr)
    {
        mOnConnected(*this, aError);
        mOnConnected = nullptr;
    }

    // Reset to the initial state.
    Reset();

    LOG_DEBUG(LOG_REGION_DTLS, "session(={}) disconnected", static_cast<void *>(this));

exit:
    return;
}